

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::RowSingletonPS::RowSingletonPS(RowSingletonPS *this,RowSingletonPS *old)

{
  int iVar1;
  int32_t iVar2;
  long lVar3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  byte bVar6;
  
  bVar6 = 0;
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_006b3da8;
  (this->super_PostStep).m_name = (old->super_PostStep).m_name;
  iVar1 = (old->super_PostStep).nRows;
  (this->super_PostStep).nCols = (old->super_PostStep).nCols;
  (this->super_PostStep).nRows = iVar1;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (old->super_PostStep)._tolerances.
       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(old->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__RowSingletonPS_006b3fb8;
  iVar1 = old->m_old_i;
  this->m_i = old->m_i;
  this->m_old_i = iVar1;
  this->m_j = old->m_j;
  pnVar4 = &old->m_lhs;
  pnVar5 = &this->m_lhs;
  for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pnVar5->m_backend).data._M_elems[0] = (pnVar4->m_backend).data._M_elems[0];
    pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar4 + (ulong)bVar6 * -8 + 4);
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar5 + (ulong)bVar6 * -8 + 4);
  }
  (this->m_lhs).m_backend.exp = (old->m_lhs).m_backend.exp;
  (this->m_lhs).m_backend.neg = (old->m_lhs).m_backend.neg;
  iVar2 = (old->m_lhs).m_backend.prec_elem;
  (this->m_lhs).m_backend.fpclass = (old->m_lhs).m_backend.fpclass;
  (this->m_lhs).m_backend.prec_elem = iVar2;
  pnVar4 = &old->m_rhs;
  pnVar5 = &this->m_rhs;
  for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pnVar5->m_backend).data._M_elems[0] = (pnVar4->m_backend).data._M_elems[0];
    pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar4 + (ulong)bVar6 * -8 + 4);
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar5 + (ulong)bVar6 * -8 + 4);
  }
  (this->m_rhs).m_backend.exp = (old->m_rhs).m_backend.exp;
  (this->m_rhs).m_backend.neg = (old->m_rhs).m_backend.neg;
  iVar2 = (old->m_rhs).m_backend.prec_elem;
  (this->m_rhs).m_backend.fpclass = (old->m_rhs).m_backend.fpclass;
  (this->m_rhs).m_backend.prec_elem = iVar2;
  this->m_strictLo = old->m_strictLo;
  this->m_strictUp = old->m_strictUp;
  this->m_maxSense = old->m_maxSense;
  pnVar4 = &old->m_obj;
  pnVar5 = &this->m_obj;
  for (lVar3 = 0xe; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)(pnVar5->m_backend).data._M_elems =
         *(undefined8 *)(pnVar4->m_backend).data._M_elems;
    pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar4 + (ulong)bVar6 * -0x10 + 8);
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  (this->m_obj).m_backend.exp = (old->m_obj).m_backend.exp;
  (this->m_obj).m_backend.neg = (old->m_obj).m_backend.neg;
  iVar2 = (old->m_obj).m_backend.prec_elem;
  (this->m_obj).m_backend.fpclass = (old->m_obj).m_backend.fpclass;
  (this->m_obj).m_backend.prec_elem = iVar2;
  (this->m_col).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
  (this->m_col).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memsize = 0;
  (this->m_col).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  (this->m_col)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006b38e0;
  (this->m_col).theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem(&this->m_col,
             (old->m_col).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memused);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(&(this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,&(old->m_col).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             );
  pnVar4 = &old->m_newLo;
  pnVar5 = &this->m_newLo;
  for (lVar3 = 0xe; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)(pnVar5->m_backend).data._M_elems =
         *(undefined8 *)(pnVar4->m_backend).data._M_elems;
    pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar4 + (ulong)bVar6 * -0x10 + 8);
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  (this->m_newLo).m_backend.exp = (old->m_newLo).m_backend.exp;
  (this->m_newLo).m_backend.neg = (old->m_newLo).m_backend.neg;
  iVar2 = (old->m_newLo).m_backend.prec_elem;
  (this->m_newLo).m_backend.fpclass = (old->m_newLo).m_backend.fpclass;
  (this->m_newLo).m_backend.prec_elem = iVar2;
  pnVar4 = &old->m_newUp;
  pnVar5 = &this->m_newUp;
  for (lVar3 = 0xe; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)(pnVar5->m_backend).data._M_elems =
         *(undefined8 *)(pnVar4->m_backend).data._M_elems;
    pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar4 + (ulong)bVar6 * -0x10 + 8);
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  (this->m_newUp).m_backend.exp = (old->m_newUp).m_backend.exp;
  (this->m_newUp).m_backend.neg = (old->m_newUp).m_backend.neg;
  iVar2 = (old->m_newUp).m_backend.prec_elem;
  (this->m_newUp).m_backend.fpclass = (old->m_newUp).m_backend.fpclass;
  (this->m_newUp).m_backend.prec_elem = iVar2;
  pnVar4 = &old->m_oldLo;
  pnVar5 = &this->m_oldLo;
  for (lVar3 = 0xe; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)(pnVar5->m_backend).data._M_elems =
         *(undefined8 *)(pnVar4->m_backend).data._M_elems;
    pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar4 + (ulong)bVar6 * -0x10 + 8);
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  (this->m_oldLo).m_backend.exp = (old->m_oldLo).m_backend.exp;
  (this->m_oldLo).m_backend.neg = (old->m_oldLo).m_backend.neg;
  iVar2 = (old->m_oldLo).m_backend.prec_elem;
  (this->m_oldLo).m_backend.fpclass = (old->m_oldLo).m_backend.fpclass;
  (this->m_oldLo).m_backend.prec_elem = iVar2;
  pnVar4 = &old->m_oldUp;
  pnVar5 = &this->m_oldUp;
  for (lVar3 = 0xe; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)(pnVar5->m_backend).data._M_elems =
         *(undefined8 *)(pnVar4->m_backend).data._M_elems;
    pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar4 + (ulong)bVar6 * -0x10 + 8);
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  (this->m_oldUp).m_backend.exp = (old->m_oldUp).m_backend.exp;
  (this->m_oldUp).m_backend.neg = (old->m_oldUp).m_backend.neg;
  iVar2 = (old->m_oldUp).m_backend.prec_elem;
  (this->m_oldUp).m_backend.fpclass = (old->m_oldUp).m_backend.fpclass;
  (this->m_oldUp).m_backend.prec_elem = iVar2;
  pnVar4 = &old->m_row_obj;
  pnVar5 = &this->m_row_obj;
  for (lVar3 = 0xe; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)(pnVar5->m_backend).data._M_elems =
         *(undefined8 *)(pnVar4->m_backend).data._M_elems;
    pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar4 + (ulong)bVar6 * -0x10 + 8);
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  (this->m_row_obj).m_backend.exp = (old->m_row_obj).m_backend.exp;
  (this->m_row_obj).m_backend.neg = (old->m_row_obj).m_backend.neg;
  iVar2 = (old->m_row_obj).m_backend.prec_elem;
  (this->m_row_obj).m_backend.fpclass = (old->m_row_obj).m_backend.fpclass;
  (this->m_row_obj).m_backend.prec_elem = iVar2;
  return;
}

Assistant:

RowSingletonPS(const RowSingletonPS& old)
         : PostStep(old)
         , m_i(old.m_i)
         , m_old_i(old.m_old_i)
         , m_j(old.m_j)
         , m_lhs(old.m_lhs)
         , m_rhs(old.m_rhs)
         , m_strictLo(old.m_strictLo)
         , m_strictUp(old.m_strictUp)
         , m_maxSense(old.m_maxSense)
         , m_obj(old.m_obj)
         , m_col(old.m_col)
         , m_newLo(old.m_newLo)
         , m_newUp(old.m_newUp)
         , m_oldLo(old.m_oldLo)
         , m_oldUp(old.m_oldUp)
         , m_row_obj(old.m_row_obj)
      {}